

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

void __thiscall LowererMDArch::FinalLower(LowererMDArch *this)

{
  OpCode OVar1;
  int iVar2;
  Lowerer *this_00;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  IntConstOpnd *this_01;
  Instr *pIVar8;
  Func *pFVar9;
  Instr *this_02;
  Instr *pIVar10;
  
  pIVar10 = this->m_func->m_headInstr;
  if (pIVar10 == (Instr *)0x0) {
    pIVar10 = (Instr *)0x0;
  }
  else {
    pIVar10 = pIVar10->m_prev;
  }
  this_02 = this->m_func->m_tailInstr;
  if (this_02 != pIVar10) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pIVar8 = this_02->m_prev;
      OVar1 = this_02->m_opcode;
      if (OVar1 - 0x3e6 < 0x10) {
        if (this_02->m_src2 != (Opnd *)0x0) {
          IR::Instr::SwapOpnds(this_02);
LAB_0064aa12:
          IR::Instr::FreeSrc2(this_02);
        }
      }
      else if (OVar1 < LdSpillSize) {
        if (OVar1 == Ret) {
          IR::Instr::Remove(this_02);
        }
        else {
          if (OVar1 != Leave) {
            if (OVar1 != LdArgSize) goto LAB_0064ad03;
            BVar6 = Func::HasTry(this->m_func);
            if (BVar6 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                                 ,0xd17,"(this->m_func->HasTry())","this->m_func->HasTry()");
              if (!bVar4) goto LAB_0064ad30;
              *puVar7 = 0;
            }
            this_02->m_opcode = MOV;
            pFVar9 = this->m_func;
            iVar2 = pFVar9->m_argsSize;
            goto LAB_0064ab49;
          }
          bVar4 = Func::DoOptimizeTry(this->m_func);
          if ((!bVar4) || (bVar4 = Func::IsLoopBodyInTry(this->m_func), bVar4)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                               ,0xd27,
                               "(this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry())"
                               ,"this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry()")
            ;
            if (!bVar4) goto LAB_0064ad30;
            *puVar7 = 0;
          }
          this_00 = this->lowererMD->m_lowerer;
          if (this_02->m_kind != InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar4) goto LAB_0064ad30;
            *puVar7 = 0;
          }
          pIVar8 = Lowerer::LowerLeave(this_00,this_02,(LabelInstr *)this_02[1].m_next,true,false);
        }
      }
      else if (OVar1 == LdSpillSize) {
        BVar6 = Func::HasTry(this->m_func);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0xd1f,"(this->m_func->HasTry())","this->m_func->HasTry()");
          if (!bVar4) goto LAB_0064ad30;
          *puVar7 = 0;
        }
        this_02->m_opcode = MOV;
        pFVar9 = this->m_func;
        iVar2 = pFVar9->m_spillSize;
LAB_0064ab49:
        this_01 = IR::IntConstOpnd::New((long)iVar2,TyUint32,pFVar9,false);
        if (this_02->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_0064ad30;
          *puVar7 = 0;
        }
        pFVar9 = this_02->m_func;
        if ((this_01->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) {
LAB_0064ad30:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
        }
        bVar5 = (this_01->super_Opnd).field_0xb;
        if ((bVar5 & 2) != 0) {
          this_01 = (IntConstOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar9);
          bVar5 = (this_01->super_Opnd).field_0xb;
        }
        (this_01->super_Opnd).field_0xb = bVar5 | 2;
        this_02->m_src1 = &this_01->super_Opnd;
        LowererMD::Legalize<false>(this_02,false);
      }
      else {
        if ((OVar1 == CMPXCHG8B) || (OVar1 == LOCKCMPXCHG8B)) {
          IR::Instr::FreeDst(this_02);
          goto LAB_0064aa12;
        }
LAB_0064ad03:
        bVar4 = IR::Instr::HasLazyBailOut(this_02);
        if (bVar4) {
          Func::SetHasLazyBailOut(this->m_func);
        }
      }
      this_02 = pIVar8;
    } while (this_02 != pIVar10);
  }
  return;
}

Assistant:

void
LowererMDArch::FinalLower()
{
    IR::IntConstOpnd *intOpnd;

    FOREACH_INSTR_BACKWARD_EDITING_IN_RANGE(instr, instrPrev, this->m_func->m_tailInstr, this->m_func->m_headInstr)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::Ret:
            instr->Remove();
            break;
        case Js::OpCode::LdArgSize:
            Assert(this->m_func->HasTry());
            instr->m_opcode = Js::OpCode::MOV;
            intOpnd = IR::IntConstOpnd::New(this->m_func->GetArgsSize(), TyUint32, this->m_func);
            instr->SetSrc1(intOpnd);
            LowererMD::Legalize(instr);
            break;

        case Js::OpCode::LdSpillSize:
            Assert(this->m_func->HasTry());
            instr->m_opcode = Js::OpCode::MOV;
            intOpnd = IR::IntConstOpnd::New(this->m_func->GetSpillSize(), TyUint32, this->m_func);
            instr->SetSrc1(intOpnd);
            LowererMD::Legalize(instr);
            break;

        case Js::OpCode::Leave:
            Assert(this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry());
            instrPrev = this->lowererMD->m_lowerer->LowerLeave(instr, instr->AsBranchInstr()->GetTarget(), true /*fromFinalLower*/);
            break;

        case Js::OpCode::CMOVA:
        case Js::OpCode::CMOVAE:
        case Js::OpCode::CMOVB:
        case Js::OpCode::CMOVBE:
        case Js::OpCode::CMOVE:
        case Js::OpCode::CMOVG:
        case Js::OpCode::CMOVGE:
        case Js::OpCode::CMOVL:
        case Js::OpCode::CMOVLE:
        case Js::OpCode::CMOVNE:
        case Js::OpCode::CMOVNO:
        case Js::OpCode::CMOVNP:
        case Js::OpCode::CMOVNS:
        case Js::OpCode::CMOVO:
        case Js::OpCode::CMOVP:
        case Js::OpCode::CMOVS:
            // Get rid of fake src1.
            if (instr->GetSrc2())
            {
                // CMOV inserted before regalloc have a dummy src1 to simulate the fact that
                // CMOV is not a definite def of the dst.
                instr->SwapOpnds();
                instr->FreeSrc2();
            }
            break;
        case Js::OpCode::LOCKCMPXCHG8B:
        case Js::OpCode::CMPXCHG8B:
            // Get rid of the deps and srcs
            instr->FreeDst();
            instr->FreeSrc2();
            break;
        default:
            if (instr->HasLazyBailOut())
            {
                // Since Lowerer and Peeps might have removed instructions with lazy bailout
                // if we attach them to helper calls, FinalLower is the first phase that
                // we can know if the function has any lazy bailouts at all.
                this->m_func->SetHasLazyBailOut();
            }

            break;
        }
    } NEXT_INSTR_BACKWARD_EDITING_IN_RANGE;
}